

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask11_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar2 = in[1] << 0xb | uVar2;
  *out = uVar2;
  uVar1 = in[2];
  *out = uVar1 << 0x16 | uVar2;
  uVar1 = uVar1 >> 10;
  out[1] = uVar1;
  uVar1 = in[3] * 2 | uVar1;
  out[1] = uVar1;
  uVar1 = in[4] << 0xc | uVar1;
  out[1] = uVar1;
  uVar2 = in[5];
  out[1] = uVar2 << 0x17 | uVar1;
  uVar2 = uVar2 >> 9;
  out[2] = uVar2;
  uVar2 = in[6] << 2 | uVar2;
  out[2] = uVar2;
  uVar2 = in[7] << 0xd | uVar2;
  out[2] = uVar2;
  uVar1 = in[8];
  out[2] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[3] = uVar1;
  uVar1 = in[9] << 3 | uVar1;
  out[3] = uVar1;
  uVar1 = in[10] << 0xe | uVar1;
  out[3] = uVar1;
  uVar2 = in[0xb];
  out[3] = uVar2 << 0x19 | uVar1;
  uVar2 = uVar2 >> 7;
  out[4] = uVar2;
  uVar2 = in[0xc] << 4 | uVar2;
  out[4] = uVar2;
  uVar2 = in[0xd] << 0xf | uVar2;
  out[4] = uVar2;
  uVar1 = in[0xe];
  out[4] = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[5] = uVar1;
  uVar1 = in[0xf] << 5 | uVar1;
  out[5] = uVar1;
  uVar1 = in[0x10] << 0x10 | uVar1;
  out[5] = uVar1;
  uVar2 = in[0x11];
  out[5] = uVar2 << 0x1b | uVar1;
  uVar2 = uVar2 >> 5;
  out[6] = uVar2;
  uVar2 = in[0x12] << 6 | uVar2;
  out[6] = uVar2;
  uVar2 = in[0x13] << 0x11 | uVar2;
  out[6] = uVar2;
  uVar1 = in[0x14];
  out[6] = uVar1 << 0x1c | uVar2;
  uVar1 = uVar1 >> 4;
  out[7] = uVar1;
  uVar1 = in[0x15] << 7 | uVar1;
  out[7] = uVar1;
  uVar1 = in[0x16] << 0x12 | uVar1;
  out[7] = uVar1;
  uVar2 = in[0x17];
  out[7] = uVar2 << 0x1d | uVar1;
  uVar2 = uVar2 >> 3;
  out[8] = uVar2;
  uVar2 = in[0x18] << 8 | uVar2;
  out[8] = uVar2;
  uVar2 = in[0x19] << 0x13 | uVar2;
  out[8] = uVar2;
  uVar1 = in[0x1a];
  out[8] = uVar1 << 0x1e | uVar2;
  uVar1 = uVar1 >> 2;
  out[9] = uVar1;
  uVar1 = in[0x1b] << 9 | uVar1;
  out[9] = uVar1;
  uVar1 = in[0x1c] << 0x14 | uVar1;
  out[9] = uVar1;
  uVar2 = in[0x1d];
  out[9] = uVar2 << 0x1f | uVar1;
  uVar2 = uVar2 >> 1;
  out[10] = uVar2;
  uVar2 = in[0x1e] << 10 | uVar2;
  out[10] = uVar2;
  out[10] = in[0x1f] << 0x15 | uVar2;
  return out + 0xb;
}

Assistant:

uint32_t *__fastpackwithoutmask11_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (11 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (11 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (11 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (11 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (11 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (11 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (11 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (11 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 19;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (11 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (11 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  ++in;

  return out;
}